

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::generateColorTextureGenerationGroup
               (vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                *group,GLenum target,int maxSamples,GLenum internalFormat)

{
  bool bVar1;
  Enum<int,_2UL> EVar2;
  bool local_855;
  GLenum local_77c;
  GetNameFunc local_768;
  int local_760;
  string local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  undefined1 local_718 [8];
  TextureLevelSpec level_7;
  TextureGenerationSpec texGen_8;
  GetNameFunc local_698;
  int local_690;
  string local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  undefined1 local_648 [8];
  TextureLevelSpec level_6;
  TextureGenerationSpec texGen_7;
  GetNameFunc local_5c8;
  int local_5c0;
  string local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  undefined1 local_578 [8];
  TextureLevelSpec level_5;
  TextureGenerationSpec texGen_6;
  GetNameFunc local_4f8;
  int local_4f0;
  string local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  int local_4a4;
  undefined1 local_4a0 [4];
  int baseSize_1;
  TextureLevelSpec level_4;
  TextureGenerationSpec texGen_5;
  GetNameFunc local_420;
  int local_418;
  string local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  int local_3cc;
  undefined1 local_3c8 [4];
  int baseSize;
  TextureLevelSpec level_3;
  TextureGenerationSpec texGen_4;
  GetNameFunc local_348;
  int local_340;
  string local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  undefined1 local_2f8 [8];
  TextureLevelSpec level_2;
  TextureGenerationSpec texGen_3;
  GetNameFunc local_278;
  int local_270;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  TextureLevelSpec level_1;
  TextureGenerationSpec texGen_2;
  GetNameFunc local_1a8;
  int local_1a0;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  TextureLevelSpec level;
  TextureGenerationSpec texGen_1;
  GetNameFunc local_c8;
  int local_c0;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  TextureGenerationSpec texGen;
  GLenum queryTarget;
  GLenum internalFormat_local;
  int maxSamples_local;
  GLenum target_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  *group_local;
  
  local_77c = target;
  if (target == 0x8513) {
    local_77c = 0x8518;
  }
  texGen.description.field_2._8_4_ = local_77c;
  texGen.description.field_2._12_4_ = internalFormat;
  TextureGenerationSpec::TextureGenerationSpec((TextureGenerationSpec *)local_78);
  local_78._4_4_ = texGen.description.field_2._8_4_;
  texGen.bindTarget._0_1_ = 1;
  texGen.queryTarget = 0;
  local_78._0_4_ = target;
  EVar2 = glu::getTextureTargetStr(target);
  texGen_1.description.field_2._8_8_ = EVar2.m_getName;
  local_c0 = EVar2.m_value;
  local_c8 = (GetNameFunc)texGen_1.description.field_2._8_8_;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b8,&local_c8);
  std::operator+(&local_98,&local_b8,", initial values");
  std::__cxx11::string::operator=
            ((string *)
             &texGen.levels.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  ::push_back(group,(value_type *)local_78);
  TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)local_78);
  bVar1 = isMultisampleTarget(target);
  if (bVar1) {
    TextureGenerationSpec::TextureGenerationSpec((TextureGenerationSpec *)&level.internalFormat);
    TextureGenerationSpec::TextureLevelSpec::TextureLevelSpec((TextureLevelSpec *)local_158);
    level._20_4_ = texGen.description.field_2._8_4_;
    texGen_1.bindTarget._0_1_ = 1;
    texGen_1.queryTarget = 1;
    texGen_1.bindTarget._1_1_ = 0;
    level.internalFormat = target;
    EVar2 = glu::getTextureTargetStr(target);
    texGen_2.description.field_2._8_8_ = EVar2.m_getName;
    local_1a0 = EVar2.m_value;
    local_1a8 = (GetNameFunc)texGen_2.description.field_2._8_8_;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_198,&local_1a8);
    std::operator+(&local_178,&local_198,", low sample count");
    std::__cxx11::string::operator=
              ((string *)
               &texGen_1.levels.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    local_158._0_4_ = 0x10;
    local_158._4_4_ = 0x10;
    bVar1 = textureTypeHasDepth(level.internalFormat);
    level.width = (uint)bVar1 * 5 + 1;
    level.height = 0;
    level.depth = texGen.description.field_2._12_4_;
    level.level._0_1_ = 0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                 *)&texGen_1.bindWholeArray,(value_type *)local_158);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(group,(value_type *)&level.internalFormat);
    TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)&level.internalFormat);
    TextureGenerationSpec::TextureGenerationSpec((TextureGenerationSpec *)&level_1.internalFormat);
    TextureGenerationSpec::TextureLevelSpec::TextureLevelSpec((TextureLevelSpec *)local_228);
    level_1._20_4_ = texGen.description.field_2._8_4_;
    texGen_2.bindTarget._0_1_ = 1;
    texGen_2.bindTarget._1_1_ = 0;
    level_1.internalFormat = target;
    texGen_2.queryTarget = maxSamples;
    EVar2 = glu::getTextureTargetStr(target);
    texGen_3.description.field_2._8_8_ = EVar2.m_getName;
    local_270 = EVar2.m_value;
    local_278 = (GetNameFunc)texGen_3.description.field_2._8_8_;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_278);
    std::operator+(&local_248,&local_268,", high sample count");
    std::__cxx11::string::operator=
              ((string *)
               &texGen_2.levels.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    local_228._0_4_ = 0x20;
    local_228._4_4_ = 0x20;
    bVar1 = textureTypeHasDepth(level_1.internalFormat);
    level_1.width = (uint)bVar1 * 5 + 1;
    level_1.height = 0;
    level_1.depth = texGen.description.field_2._12_4_;
    level_1.level._0_1_ = 0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                 *)&texGen_2.bindWholeArray,(value_type *)local_228);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(group,(value_type *)&level_1.internalFormat);
    TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)&level_1.internalFormat);
    TextureGenerationSpec::TextureGenerationSpec((TextureGenerationSpec *)&level_2.internalFormat);
    TextureGenerationSpec::TextureLevelSpec::TextureLevelSpec((TextureLevelSpec *)local_2f8);
    level_2._20_4_ = texGen.description.field_2._8_4_;
    texGen_3.bindTarget._0_1_ = 1;
    texGen_3.bindTarget._1_1_ = 1;
    level_2.internalFormat = target;
    texGen_3.queryTarget = maxSamples;
    EVar2 = glu::getTextureTargetStr(target);
    texGen_4.description.field_2._8_8_ = EVar2.m_getName;
    local_340 = EVar2.m_value;
    local_348 = (GetNameFunc)texGen_4.description.field_2._8_8_;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_338,&local_348);
    std::operator+(&local_318,&local_338,", fixed sample positions");
    std::__cxx11::string::operator=
              ((string *)
               &texGen_3.levels.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    local_2f8._0_4_ = 0x20;
    local_2f8._4_4_ = 0x20;
    bVar1 = textureTypeHasDepth(level_2.internalFormat);
    level_2.width = (uint)bVar1 * 5 + 1;
    level_2.height = 0;
    level_2.depth = texGen.description.field_2._12_4_;
    level_2.level._0_1_ = 0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                 *)&texGen_3.bindWholeArray,(value_type *)local_2f8);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(group,(value_type *)&level_2.internalFormat);
    TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)&level_2.internalFormat);
  }
  else if (target == 0x8c2a) {
    TextureGenerationSpec::TextureGenerationSpec((TextureGenerationSpec *)&level_3.internalFormat);
    TextureGenerationSpec::TextureLevelSpec::TextureLevelSpec((TextureLevelSpec *)local_3c8);
    local_3cc = getPixelSize(texGen.description.field_2._12_4_);
    level_3._20_4_ = texGen.description.field_2._8_4_;
    texGen_4.bindTarget._0_1_ = 1;
    level_3.internalFormat = target;
    EVar2 = glu::getTextureTargetStr(0x8c2a);
    texGen_5.description.field_2._8_8_ = EVar2.m_getName;
    local_418 = EVar2.m_value;
    local_420 = (GetNameFunc)texGen_5.description.field_2._8_8_;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_410,&local_420);
    std::operator+(&local_3f0,&local_410,", whole buffer");
    std::__cxx11::string::operator=
              ((string *)
               &texGen_4.levels.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_410);
    texGen_4.immutable = false;
    texGen_4.fixedSamplePos = false;
    texGen_4._10_2_ = 0;
    texGen_4.sampleCount = local_3cc * 0x21 + -1;
    texGen_4.texBufferDataOffset._0_1_ = 1;
    local_3c8 = (undefined1  [4])0x20;
    baseSize = 1;
    level_3.width = 1;
    level_3.height = 0;
    level_3.depth = texGen.description.field_2._12_4_;
    level_3.level._0_1_ = 0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                 *)&texGen_4.bindWholeArray,(value_type *)local_3c8);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(group,(value_type *)&level_3.internalFormat);
    TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)&level_3.internalFormat);
    TextureGenerationSpec::TextureGenerationSpec((TextureGenerationSpec *)&level_4.internalFormat);
    TextureGenerationSpec::TextureLevelSpec::TextureLevelSpec((TextureLevelSpec *)local_4a0);
    local_4a4 = getPixelSize(texGen.description.field_2._12_4_);
    level_4._20_4_ = texGen.description.field_2._8_4_;
    texGen_5.bindTarget._0_1_ = 1;
    level_4.internalFormat = target;
    EVar2 = glu::getTextureTargetStr(0x8c2a);
    texGen_6.description.field_2._8_8_ = EVar2.m_getName;
    local_4f0 = EVar2.m_value;
    local_4f8 = (GetNameFunc)texGen_6.description.field_2._8_8_;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_4e8,&local_4f8);
    std::operator+(&local_4c8,&local_4e8,", partial buffer");
    std::__cxx11::string::operator=
              ((string *)
               &texGen_5.levels.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4e8);
    texGen_5.immutable = false;
    texGen_5.fixedSamplePos = true;
    texGen_5._10_2_ = 0;
    texGen_5.sampleCount = local_4a4 * 0x11 + -1;
    texGen_5.texBufferDataOffset._0_1_ = 0;
    local_4a0 = (undefined1  [4])0x10;
    baseSize_1 = 1;
    level_4.width = 1;
    level_4.height = 0;
    level_4.depth = texGen.description.field_2._12_4_;
    level_4.level._0_1_ = 0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                 *)&texGen_5.bindWholeArray,(value_type *)local_4a0);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(group,(value_type *)&level_4.internalFormat);
    TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)&level_4.internalFormat);
  }
  else {
    TextureGenerationSpec::TextureGenerationSpec((TextureGenerationSpec *)&level_5.internalFormat);
    TextureGenerationSpec::TextureLevelSpec::TextureLevelSpec((TextureLevelSpec *)local_578);
    level_5._20_4_ = texGen.description.field_2._8_4_;
    texGen_6.bindTarget._0_1_ = 1;
    level_5.internalFormat = target;
    EVar2 = glu::getTextureTargetStr(target);
    texGen_7.description.field_2._8_8_ = EVar2.m_getName;
    local_5c0 = EVar2.m_value;
    local_5c8 = (GetNameFunc)texGen_7.description.field_2._8_8_;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_5b8,&local_5c8);
    std::operator+(&local_598,&local_5b8,", immutable");
    std::__cxx11::string::operator=
              ((string *)
               &texGen_6.levels.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_598);
    std::__cxx11::string::~string((string *)&local_598);
    std::__cxx11::string::~string((string *)&local_5b8);
    local_578._0_4_ = 0x20;
    local_578._4_4_ = 0x20;
    bVar1 = textureTypeHasDepth(level_5.internalFormat);
    level_5.width = (uint)bVar1 * 5 + 1;
    level_5.height = 0;
    level_5.depth = texGen.description.field_2._12_4_;
    level_5.level._0_1_ = 0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                 *)&texGen_6.bindWholeArray,(value_type *)local_578);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(group,(value_type *)&level_5.internalFormat);
    TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)&level_5.internalFormat);
    TextureGenerationSpec::TextureGenerationSpec((TextureGenerationSpec *)&level_6.internalFormat);
    TextureGenerationSpec::TextureLevelSpec::TextureLevelSpec((TextureLevelSpec *)local_648);
    level_6._20_4_ = texGen.description.field_2._8_4_;
    texGen_7.bindTarget._0_1_ = 0;
    level_6.internalFormat = target;
    EVar2 = glu::getTextureTargetStr(target);
    texGen_8.description.field_2._8_8_ = EVar2.m_getName;
    local_690 = EVar2.m_value;
    local_698 = (GetNameFunc)texGen_8.description.field_2._8_8_;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_688,&local_698);
    std::operator+(&local_668,&local_688,", mutable");
    std::__cxx11::string::operator=
              ((string *)
               &texGen_7.levels.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_668);
    std::__cxx11::string::~string((string *)&local_668);
    std::__cxx11::string::~string((string *)&local_688);
    local_648._0_4_ = 0x10;
    local_648._4_4_ = 0x40;
    if (target == 0x8513 || target == 0x9009) {
      local_648._4_4_ = 0x10;
    }
    bVar1 = textureTypeHasDepth(level_6.internalFormat);
    level_6.width = (uint)bVar1 * 5 + 1;
    level_6.height = 0;
    level_6.depth = texGen.description.field_2._12_4_;
    level_6.level._0_1_ = 0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                 *)&texGen_7.bindWholeArray,(value_type *)local_648);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(group,(value_type *)&level_6.internalFormat);
    TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)&level_6.internalFormat);
    TextureGenerationSpec::TextureGenerationSpec((TextureGenerationSpec *)&level_7.internalFormat);
    TextureGenerationSpec::TextureLevelSpec::TextureLevelSpec((TextureLevelSpec *)local_718);
    level_7._20_4_ = texGen.description.field_2._8_4_;
    texGen_8.bindTarget._0_1_ = 0;
    level_7.internalFormat = target;
    EVar2 = glu::getTextureTargetStr(target);
    local_768 = EVar2.m_getName;
    local_760 = EVar2.m_value;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_758,&local_768);
    std::operator+(&local_738,&local_758,", mip level 3");
    std::__cxx11::string::operator=
              ((string *)
               &texGen_8.levels.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_738);
    std::__cxx11::string::~string((string *)&local_738);
    std::__cxx11::string::~string((string *)&local_758);
    local_718._0_4_ = 4;
    local_855 = target == 0x8513 || target == 0x9009;
    local_718._4_4_ = ((byte)~local_855 & 1) * 4 + 4;
    bVar1 = textureTypeHasDepth(level_7.internalFormat);
    level_7.width = (uint)bVar1 * 5 + 1;
    level_7.height = 3;
    level_7.depth = texGen.description.field_2._12_4_;
    level_7.level._0_1_ = 0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                 *)&texGen_8.bindWholeArray,(value_type *)local_718);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(group,(value_type *)&level_7.internalFormat);
    TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)&level_7.internalFormat);
  }
  return;
}

Assistant:

static void generateColorTextureGenerationGroup (std::vector<TextureGenerationSpec>& group, glw::GLenum target, int maxSamples, glw::GLenum internalFormat)
{
	const glw::GLenum queryTarget = (target == GL_TEXTURE_CUBE_MAP) ? (GL_TEXTURE_CUBE_MAP_NEGATIVE_Y) : (target);

	// initial
	{
		TextureGenerationSpec texGen;
		texGen.bindTarget		= target;
		texGen.queryTarget		= queryTarget;
		texGen.immutable		= true;
		texGen.sampleCount		= 0;
		texGen.description		= glu::getTextureTargetStr(target).toString() + ", initial values";

		group.push_back(texGen);
	}

	// ms targets
	if (isMultisampleTarget(target))
	{
		{
			TextureGenerationSpec					texGen;
			TextureGenerationSpec::TextureLevelSpec	level;

			texGen.bindTarget		= target;
			texGen.queryTarget		= queryTarget;
			texGen.immutable		= true;
			texGen.sampleCount		= 1;
			texGen.fixedSamplePos	= false;
			texGen.description		= glu::getTextureTargetStr(target).toString() + ", low sample count";

			level.width				= 16;
			level.height			= 16;
			level.depth				= (textureTypeHasDepth(texGen.bindTarget)) ? (6) : (1);
			level.level				= 0;
			level.internalFormat	= internalFormat;
			level.compressed		= false;

			texGen.levels.push_back(level);
			group.push_back(texGen);
		}
		{
			TextureGenerationSpec					texGen;
			TextureGenerationSpec::TextureLevelSpec	level;

			texGen.bindTarget		= target;
			texGen.queryTarget		= queryTarget;
			texGen.immutable		= true;
			texGen.sampleCount		= maxSamples;
			texGen.fixedSamplePos	= false;
			texGen.description		= glu::getTextureTargetStr(target).toString() + ", high sample count";

			level.width				= 32;
			level.height			= 32;
			level.depth				= (textureTypeHasDepth(texGen.bindTarget)) ? (6) : (1);
			level.level				= 0;
			level.internalFormat	= internalFormat;
			level.compressed		= false;

			texGen.levels.push_back(level);
			group.push_back(texGen);
		}
		{
			TextureGenerationSpec					texGen;
			TextureGenerationSpec::TextureLevelSpec	level;

			texGen.bindTarget		= target;
			texGen.queryTarget		= queryTarget;
			texGen.immutable		= true;
			texGen.sampleCount		= maxSamples;
			texGen.fixedSamplePos	= true;
			texGen.description		= glu::getTextureTargetStr(target).toString() + ", fixed sample positions";

			level.width				= 32;
			level.height			= 32;
			level.depth				= (textureTypeHasDepth(texGen.bindTarget)) ? (6) : (1);
			level.level				= 0;
			level.internalFormat	= internalFormat;
			level.compressed		= false;

			texGen.levels.push_back(level);
			group.push_back(texGen);
		}
	}
	else if (target == GL_TEXTURE_BUFFER)
	{
		// whole buffer
		{
			TextureGenerationSpec					texGen;
			TextureGenerationSpec::TextureLevelSpec	level;
			const int								baseSize = getPixelSize(internalFormat);

			texGen.bindTarget			= target;
			texGen.queryTarget			= queryTarget;
			texGen.immutable			= true;
			texGen.description			= glu::getTextureTargetStr(target).toString() + ", whole buffer";
			texGen.texBufferDataOffset	= 0;
			texGen.texBufferDataSize	= 32 * baseSize + (baseSize - 1);
			texGen.bindWholeArray		= true;

			level.width				= 32;
			level.height			= 1;
			level.depth				= 1;
			level.level				= 0;
			level.internalFormat	= internalFormat;
			level.compressed		= false;

			texGen.levels.push_back(level);
			group.push_back(texGen);
		}
		// partial buffer
		{
			TextureGenerationSpec					texGen;
			TextureGenerationSpec::TextureLevelSpec	level;
			const int								baseSize = getPixelSize(internalFormat);

			texGen.bindTarget			= target;
			texGen.queryTarget			= queryTarget;
			texGen.immutable			= true;
			texGen.description			= glu::getTextureTargetStr(target).toString() + ", partial buffer";
			texGen.texBufferDataOffset	= 256;
			texGen.texBufferDataSize	= 16 * baseSize + (baseSize - 1);
			texGen.bindWholeArray		= false;

			level.width				= 16;
			level.height			= 1;
			level.depth				= 1;
			level.level				= 0;
			level.internalFormat	= internalFormat;
			level.compressed		= false;

			texGen.levels.push_back(level);
			group.push_back(texGen);
		}
	}
	else
	{
		// immutable
		{
			TextureGenerationSpec					texGen;
			TextureGenerationSpec::TextureLevelSpec	level;

			texGen.bindTarget		= target;
			texGen.queryTarget		= queryTarget;
			texGen.immutable		= true;
			texGen.description		= glu::getTextureTargetStr(target).toString() + ", immutable";

			level.width				= 32;
			level.height			= 32;
			level.depth				= (textureTypeHasDepth(texGen.bindTarget)) ? (6) : (1);
			level.level				= 0;
			level.internalFormat	= internalFormat;
			level.compressed		= false;

			texGen.levels.push_back(level);
			group.push_back(texGen);
		}
		// mutable
		{
			TextureGenerationSpec					texGen;
			TextureGenerationSpec::TextureLevelSpec	level;

			texGen.bindTarget		= target;
			texGen.queryTarget		= queryTarget;
			texGen.immutable		= false;
			texGen.description		= glu::getTextureTargetStr(target).toString() + ", mutable";

			level.width				= 16;
			level.height			= (target == GL_TEXTURE_CUBE_MAP || target == GL_TEXTURE_CUBE_MAP_ARRAY) ? (16) : (64);
			level.depth				= (textureTypeHasDepth(texGen.bindTarget)) ? (6) : (1);
			level.level				= 0;
			level.internalFormat	= internalFormat;
			level.compressed		= false;

			texGen.levels.push_back(level);
			group.push_back(texGen);
		}
		// mip3
		{
			TextureGenerationSpec					texGen;
			TextureGenerationSpec::TextureLevelSpec	level;

			texGen.bindTarget		= target;
			texGen.queryTarget		= queryTarget;
			texGen.immutable		= false;
			texGen.description		= glu::getTextureTargetStr(target).toString() + ", mip level 3";

			level.width				= 4;
			level.height			= (target == GL_TEXTURE_CUBE_MAP || target == GL_TEXTURE_CUBE_MAP_ARRAY) ? (4) : (8);
			level.depth				= (textureTypeHasDepth(texGen.bindTarget)) ? (6) : (1);
			level.level				= 3;
			level.internalFormat	= internalFormat;
			level.compressed		= false;

			texGen.levels.push_back(level);
			group.push_back(texGen);
		}
	}
}